

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

bool verifySignature_ECDSA_SHA1(u8 *cert,bool is3DS)

{
  int iVar1;
  uchar *in_RCX;
  u8 *hash_00;
  size_t in_RDX;
  size_t n;
  undefined7 in_register_00000031;
  uchar *R;
  u8 *local_c8;
  uint8_t local_a8 [8];
  u8 hash [20];
  undefined1 local_88 [8];
  SHA1 s;
  bool is3DS_local;
  u8 *cert_local;
  
  s.m_byteCount._7_1_ = is3DS;
  sha1::SHA1::SHA1((SHA1 *)local_88,(uchar *)CONCAT71(in_register_00000031,is3DS),in_RDX,in_RCX);
  sha1::SHA1::processBytes((SHA1 *)local_88,cert + 0x80,0x100);
  sha1::SHA1::getDigestBytes((SHA1 *)local_88,local_a8);
  if ((s.m_byteCount._7_1_ & 1) == 0) {
    local_c8 = "";
  }
  else {
    local_c8 = "";
  }
  R = cert + 4;
  hash_00 = local_a8;
  iVar1 = check_ecdsa(local_c8,R,cert + 0x22,hash_00,0);
  sha1::SHA1::~SHA1((SHA1 *)local_88,R,n,hash_00);
  return iVar1 != 0;
}

Assistant:

bool verifySignature_ECDSA_SHA1(u8 *cert, bool is3DS)
{
    sha1::SHA1 s;
    u8 hash[20];

    s.processBytes(cert + 0x80, CertLength - 0x80);
    s.getDigestBytes(hash);

    return check_ecdsa(const_cast<u8 *>(is3DS ? Q_3DS : Q_WiiU),
        cert + 4, cert + 4 + 30, hash, false);
}